

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genDependentAggLoopString
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,size_t currentLoop,
          size_t depth,dyn_bitset *contributingViews,size_t maxDepth,string *resetString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer pDVar3;
  pointer pcVar4;
  size_t *psVar5;
  pointer pvVar6;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  char cVar7;
  bool bVar8;
  pointer pbVar9;
  long *plVar10;
  undefined8 *puVar11;
  size_t sVar12;
  ulong uVar13;
  pointer pvVar14;
  size_type v_id;
  View *pVVar15;
  Attribute *pAVar16;
  View *pVVar17;
  size_t sVar18;
  size_type *psVar19;
  long *plVar20;
  undefined8 *puVar21;
  pointer pAVar22;
  long lVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  ulong uVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  string *psVar29;
  undefined8 uVar30;
  ulong *puVar31;
  string *psVar32;
  pointer pAVar33;
  size_t *psVar34;
  ulong uVar35;
  long lVar36;
  byte bVar37;
  string local_608;
  string __str_2;
  string closeLoopString;
  size_t off;
  size_type local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  string __str_1;
  string __str_14;
  string loopString;
  string productString;
  ulong *local_4a0;
  long local_498;
  ulong local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  unsigned_long local_460;
  size_type local_458;
  ulong *local_450;
  long local_448;
  ulong local_440;
  long lStack_438;
  pointer local_430;
  ulong *local_428;
  long local_420;
  ulong local_418;
  undefined8 uStack_410;
  TDNode *local_408;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  undefined8 uStack_3c8;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 uStack_388;
  ulong *local_380;
  long local_378;
  ulong local_370;
  undefined8 uStack_368;
  string depthString;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  long lStack_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  long lStack_2a8;
  ulong *local_2a0;
  long local_298;
  ulong local_290;
  long lStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  size_type local_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  size_t outViewID;
  long local_150;
  long local_148;
  long lStack_140;
  pointer local_138;
  long local_130;
  ulong local_128;
  ulong *local_120;
  undefined8 local_118;
  ulong local_110;
  undefined8 uStack_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar37 = 0;
  local_138 = (this->depListOfLoops).
              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_128 = currentLoop * 0x138;
  pDVar3 = local_138 + currentLoop;
  local_430 = (pointer)contributingViews;
  local_200 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                        (&pDVar3->loopFactors);
  local_e0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cVar27 = '\x01';
  if (9 < depth) {
    sVar18 = depth;
    cVar28 = '\x04';
    do {
      cVar27 = cVar28;
      if (sVar18 < 100) {
        cVar27 = cVar27 + -2;
        goto LAB_00241754;
      }
      if (sVar18 < 1000) {
        cVar27 = cVar27 + -1;
        goto LAB_00241754;
      }
      if (sVar18 < 10000) goto LAB_00241754;
      bVar8 = 99999 < sVar18;
      sVar18 = sVar18 / 10000;
      cVar28 = cVar27 + '\x04';
    } while (bVar8);
    cVar27 = cVar27 + '\x01';
  }
LAB_00241754:
  depthString._M_dataplus._M_p = (pointer)&depthString.field_2;
  local_460 = depth;
  local_58 = &pDVar3->loopFactors;
  std::__cxx11::string::_M_construct((ulong)&depthString,cVar27);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (depthString._M_dataplus._M_p,(uint)depthString._M_string_length,local_460);
  pvVar2 = (this->localProductList).
           super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_458 = currentLoop * 3;
  pbVar9 = pvVar2[currentLoop].
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_408 = node;
  if (*(pointer *)
       ((long)&pvVar2[currentLoop].
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data + 8) != pbVar9) {
    cVar27 = (char)local_200;
    cVar28 = (char)local_460;
    uVar35 = 0;
    do {
      genProductString_abi_cxx11_(&productString,this,node,(dyn_bitset *)local_430,pbVar9 + uVar35);
      __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_14,(cVar27 + cVar28) * '\x03' + '\t');
      plVar10 = (long *)std::__cxx11::string::append((char *)&__str_14);
      puVar31 = (ulong *)(plVar10 + 2);
      if ((ulong *)*plVar10 == puVar31) {
        local_598._M_allocated_capacity = *puVar31;
        local_598._8_8_ = plVar10[3];
        off = (size_t)&local_598;
      }
      else {
        local_598._M_allocated_capacity = *puVar31;
        off = (size_t)*plVar10;
      }
      local_5a0 = plVar10[1];
      *plVar10 = (long)puVar31;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar25 = this->productCounter;
      cVar26 = '\x01';
      if (9 < uVar25) {
        uVar13 = uVar25;
        cVar7 = '\x04';
        do {
          cVar26 = cVar7;
          if (uVar13 < 100) {
            cVar26 = cVar26 + -2;
            goto LAB_0024190c;
          }
          if (uVar13 < 1000) {
            cVar26 = cVar26 + -1;
            goto LAB_0024190c;
          }
          if (uVar13 < 10000) goto LAB_0024190c;
          bVar8 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar7 = cVar26 + '\x04';
        } while (bVar8);
        cVar26 = cVar26 + '\x01';
      }
LAB_0024190c:
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,cVar26);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar25);
      node = local_408;
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)off != &local_598) {
        uVar30 = local_598._M_allocated_capacity;
      }
      if ((ulong)uVar30 < __str_1._M_string_length + local_5a0) {
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar30 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < __str_1._M_string_length + local_5a0) goto LAB_002419a5;
        puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,off);
      }
      else {
LAB_002419a5:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&off,(ulong)__str_1._M_dataplus._M_p);
      }
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      psVar19 = puVar11 + 2;
      if ((size_type *)*puVar11 == psVar19) {
        __str_2.field_2._M_allocated_capacity = *psVar19;
        __str_2.field_2._8_8_ = puVar11[3];
      }
      else {
        __str_2.field_2._M_allocated_capacity = *psVar19;
        __str_2._M_dataplus._M_p = (pointer)*puVar11;
      }
      __str_2._M_string_length = puVar11[1];
      *puVar11 = psVar19;
      puVar11[1] = 0;
      *(char *)psVar19 = '\0';
      plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        local_608.field_2._M_allocated_capacity = *psVar19;
        local_608.field_2._8_8_ = plVar10[3];
      }
      else {
        local_608.field_2._M_allocated_capacity = *psVar19;
        local_608._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_608._M_string_length = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_608,(ulong)productString._M_dataplus._M_p);
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        closeLoopString.field_2._M_allocated_capacity = *psVar19;
        closeLoopString.field_2._8_8_ = plVar10[3];
        closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      }
      else {
        closeLoopString.field_2._M_allocated_capacity = *psVar19;
        closeLoopString._M_dataplus._M_p = (pointer)*plVar10;
      }
      closeLoopString._M_string_length = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        loopString.field_2._M_allocated_capacity = *psVar19;
        loopString.field_2._8_8_ = plVar10[3];
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
      }
      else {
        loopString.field_2._M_allocated_capacity = *psVar19;
        loopString._M_dataplus._M_p = (pointer)*plVar10;
      }
      loopString._M_string_length = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)loopString._M_dataplus._M_p != &loopString.field_2) {
        operator_delete(loopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)off != &local_598) {
        operator_delete((void *)off);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
        operator_delete(__str_14._M_dataplus._M_p);
      }
      sVar18 = this->productCounter;
      *(size_t *)
       (*(long *)((long)&(((this->depLocalProductRemapping).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + local_458 * 8) + uVar35 * 8) = sVar18;
      this->productCounter = sVar18 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)productString._M_dataplus._M_p != &productString.field_2) {
        operator_delete(productString._M_dataplus._M_p);
      }
      uVar35 = uVar35 + 1;
      pvVar2 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = *(pointer *)
                ((long)&(pvVar2->
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        )._M_impl.super__Vector_impl_data + local_458 * 8);
    } while (uVar35 < (ulong)((*(long *)((long)&(pvVar2->
                                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                                )._M_impl.super__Vector_impl_data +
                                        local_458 * 8 + 8) - (long)pbVar9 >> 6) *
                             -0x5555555555555555));
  }
  pvVar14 = (this->newAggregateRegister).
            super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar23 = *(long *)((long)&(pvVar14->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)
                            ._M_impl.super__Vector_impl_data + local_458 * 8);
  if (*(long *)((long)&(pvVar14->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                       _M_impl.super__Vector_impl_data + local_458 * 8 + 8) != lVar23) {
    cVar27 = (char)local_200;
    cVar28 = (char)local_460;
    uVar35 = 0;
    do {
      if (*(char *)(lVar23 + uVar35 * 0x70 + 0x41) == '\x01') {
        local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_608,(cVar27 + cVar28) * '\x03' + '\t');
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_608);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          closeLoopString.field_2._M_allocated_capacity = *psVar19;
          closeLoopString.field_2._8_8_ = plVar10[3];
          closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
        }
        else {
          closeLoopString.field_2._M_allocated_capacity = *psVar19;
          closeLoopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        closeLoopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = this->aggregateCounter;
        cVar26 = '\x01';
        if (9 < uVar25) {
          uVar13 = uVar25;
          cVar7 = '\x04';
          do {
            cVar26 = cVar7;
            if (uVar13 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_00241d7c;
            }
            if (uVar13 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_00241d7c;
            }
            if (uVar13 < 10000) goto LAB_00241d7c;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar26 + '\x04';
          } while (bVar8);
          cVar26 = cVar26 + '\x01';
        }
LAB_00241d7c:
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_2,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar25);
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          uVar30 = closeLoopString.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length) {
          uVar30 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            uVar30 = __str_2.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length)
          goto LAB_00241def;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&__str_2,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p
                              );
        }
        else {
LAB_00241def:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
        }
        psVar19 = puVar11 + 2;
        if ((size_type *)*puVar11 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = puVar11[3];
          loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*puVar11;
        }
        loopString._M_string_length = puVar11[1];
        *puVar11 = psVar19;
        puVar11[1] = 0;
        *(char *)psVar19 = '\0';
        plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString.field_2._8_8_ = plVar10[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString._M_dataplus._M_p = (pointer)*plVar10;
        }
        productString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        puVar31 = (ulong *)(lVar23 + uVar35 * 0x70);
        paVar24 = &productString.field_2;
        if (*puVar31 <
            (ulong)(((long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97)) {
          uVar25 = *(ulong *)(*(long *)&(this->depAggregateRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[*puVar31].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data + puVar31[1] * 8);
          cVar26 = '\x01';
          if (9 < uVar25) {
            uVar13 = uVar25;
            cVar7 = '\x04';
            do {
              cVar26 = cVar7;
              if (uVar13 < 100) {
                cVar26 = cVar26 + -2;
                goto LAB_00242001;
              }
              if (uVar13 < 1000) {
                cVar26 = cVar26 + -1;
                goto LAB_00242001;
              }
              if (uVar13 < 10000) goto LAB_00242001;
              bVar8 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar7 = cVar26 + '\x04';
            } while (bVar8);
            cVar26 = cVar26 + '\x01';
          }
LAB_00242001:
          productString._M_dataplus._M_p = (pointer)paVar24;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar26);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar25);
          std::operator+(&closeLoopString,"aggregateRegister[",&productString);
          plVar10 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar19 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar19) {
            loopString.field_2._M_allocated_capacity = *psVar19;
            loopString.field_2._8_8_ = plVar10[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar19;
            loopString._M_dataplus._M_p = (pointer)*plVar10;
          }
          loopString._M_string_length = plVar10[1];
          *plVar10 = (long)psVar19;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != paVar24) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        if ((char)puVar31[2] == '\x01') {
          uVar25 = *(ulong *)(*(long *)((long)&(((this->depLocalProductRemapping).
                                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               )._M_impl.super__Vector_impl_data + local_458 * 8) +
                             puVar31[3] * 8);
          cVar26 = '\x01';
          if (9 < uVar25) {
            uVar13 = uVar25;
            cVar7 = '\x04';
            do {
              cVar26 = cVar7;
              if (uVar13 < 100) {
                cVar26 = cVar26 + -2;
                goto LAB_0024218c;
              }
              if (uVar13 < 1000) {
                cVar26 = cVar26 + -1;
                goto LAB_0024218c;
              }
              if (uVar13 < 10000) goto LAB_0024218c;
              bVar8 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar7 = cVar26 + '\x04';
            } while (bVar8);
            cVar26 = cVar26 + '\x01';
          }
LAB_0024218c:
          productString._M_dataplus._M_p = (pointer)paVar24;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar26);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar25);
          std::operator+(&closeLoopString,"localRegister[",&productString);
          plVar10 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar19 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar19) {
            loopString.field_2._M_allocated_capacity = *psVar19;
            loopString.field_2._8_8_ = plVar10[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar19;
            loopString._M_dataplus._M_p = (pointer)*plVar10;
          }
          loopString._M_string_length = plVar10[1];
          *plVar10 = (long)psVar19;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != paVar24) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        if (*(char *)((long)puVar31 + 0x51) == '\x01') {
          std::operator+(&local_608,"aggregates_",this->viewName + puVar31[0xb]);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_608);
          psVar19 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar19) {
            closeLoopString.field_2._M_allocated_capacity = *psVar19;
            closeLoopString.field_2._8_8_ = plVar10[3];
            closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
          }
          else {
            closeLoopString.field_2._M_allocated_capacity = *psVar19;
            closeLoopString._M_dataplus._M_p = (pointer)*plVar10;
          }
          closeLoopString._M_string_length = plVar10[1];
          *plVar10 = (long)psVar19;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          uVar25 = puVar31[0xc];
          cVar26 = '\x01';
          if (9 < uVar25) {
            uVar13 = uVar25;
            cVar7 = '\x04';
            do {
              cVar26 = cVar7;
              if (uVar13 < 100) {
                cVar26 = cVar26 + -2;
                goto LAB_0024236b;
              }
              if (uVar13 < 1000) {
                cVar26 = cVar26 + -1;
                goto LAB_0024236b;
              }
              if (uVar13 < 10000) goto LAB_0024236b;
              bVar8 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar7 = cVar26 + '\x04';
            } while (bVar8);
            cVar26 = cVar26 + '\x01';
          }
LAB_0024236b:
          __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_2,cVar26);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar25);
          uVar30 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            uVar30 = closeLoopString.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length) {
            uVar30 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              uVar30 = __str_2.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length)
            goto LAB_002423de;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&__str_2,0,(char *)0x0,
                                 (ulong)closeLoopString._M_dataplus._M_p);
          }
          else {
LAB_002423de:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
          }
          psVar19 = puVar11 + 2;
          if ((size_type *)*puVar11 == psVar19) {
            loopString.field_2._M_allocated_capacity = *psVar19;
            loopString.field_2._8_8_ = puVar11[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar19;
            loopString._M_dataplus._M_p = (pointer)*puVar11;
          }
          loopString._M_string_length = puVar11[1];
          *puVar11 = psVar19;
          puVar11[1] = 0;
          *(char *)psVar19 = '\0';
          plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
          psVar19 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar19) {
            productString.field_2._M_allocated_capacity = *psVar19;
            productString.field_2._8_8_ = plVar10[3];
            productString._M_dataplus._M_p = (pointer)paVar24;
          }
          else {
            productString.field_2._M_allocated_capacity = *psVar19;
            productString._M_dataplus._M_p = (pointer)*plVar10;
          }
          productString._M_string_length = plVar10[1];
          *plVar10 = (long)psVar19;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != paVar24) {
            operator_delete(productString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            operator_delete(__str_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        sVar18 = this->aggregateCounter;
        *(size_t *)
         (*(long *)((long)&(((this->depAggregateRemapping).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + local_458 * 8) + uVar35 * 8) = sVar18;
        this->aggregateCounter = sVar18 + 1;
        pvVar14 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar35 = uVar35 + 1;
      lVar23 = *(long *)((long)&(pvVar14->
                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                                _M_impl.super__Vector_impl_data + local_458 * 8);
    } while (uVar35 < (ulong)((*(long *)((long)&(pvVar14->
                                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                )._M_impl.super__Vector_impl_data +
                                        local_458 * 8 + 8) - lVar23 >> 4) * 0x6db6db6db6db6db7));
  }
  local_138 = (pointer)((long)(local_138->branchFunctions).super__Base_bitset<24UL>._M_w +
                       (local_128 - 0x78));
  lVar23 = *(long *)((long)local_138 + 0x18);
  if (*(long *)((long)local_138 + 0x20) != lVar23) {
    cVar27 = (char)(local_200 + local_460) * '\x03' + '\t';
    local_130 = (local_200 + local_460) * 3 + 0xc;
    local_128 = 0;
    do {
      b = local_58;
      sVar18 = *(size_t *)(lVar23 + local_128 * 8);
      pDVar3 = (this->depListOfLoops).
               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
               super__Vector_impl_data._M_start;
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &productString,&pDVar3[sVar18].loopFactors,local_58);
      bVar8 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &productString,b);
      if (productString._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(productString._M_dataplus._M_p);
      }
      if (!bVar8) break;
      uVar35 = pDVar3[sVar18].loopVariable;
      productString._M_dataplus._M_p = (pointer)&productString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&productString,"","");
      loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&loopString,"","");
      closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&closeLoopString,"","");
      sVar12 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      if (uVar35 < sVar12) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,cVar27);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_50);
        outViewID = (size_t)&local_148;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_148 = *plVar20;
          lStack_140 = plVar10[3];
        }
        else {
          local_148 = *plVar20;
          outViewID = (size_t)*plVar10;
        }
        local_150 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&outViewID,
                                     (ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_100 = &local_f0;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_f0 = *puVar31;
          lStack_e8 = plVar10[3];
        }
        else {
          local_f0 = *puVar31;
          local_100 = (ulong *)*plVar10;
        }
        local_f8 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_300 = &local_2f0;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_2f0 = *puVar31;
          lStack_2e8 = plVar10[3];
        }
        else {
          local_2f0 = *puVar31;
          local_300 = (ulong *)*plVar10;
        }
        local_2f8 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_300,
                                     (ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_2e0 = &local_2d0;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_2d0 = *puVar31;
          lStack_2c8 = plVar10[3];
        }
        else {
          local_2d0 = *puVar31;
          local_2e0 = (ulong *)*plVar10;
        }
        local_2d8 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_2c0 = &local_2b0;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_2b0 = *puVar31;
          lStack_2a8 = plVar10[3];
        }
        else {
          local_2b0 = *puVar31;
          local_2c0 = (ulong *)*plVar10;
        }
        local_2b8 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2c0,(ulong)depthString._M_dataplus._M_p);
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_110 = *puVar31;
          uStack_108 = puVar11[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *puVar31;
          local_120 = (ulong *)*puVar11;
        }
        local_118 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_1e8 = *puVar31;
          lStack_1e0 = puVar11[3];
          local_1f8 = &local_1e8;
        }
        else {
          local_1e8 = *puVar31;
          local_1f8 = (ulong *)*puVar11;
        }
        local_1f0 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_78 = local_68;
        std::__cxx11::string::_M_construct((ulong)&local_78,cVar27);
        uVar25 = 0xf;
        if (local_1f8 != &local_1e8) {
          uVar25 = local_1e8;
        }
        if (uVar25 < (ulong)(local_70 + local_1f0)) {
          uVar25 = 0xf;
          if (local_78 != local_68) {
            uVar25 = local_68[0];
          }
          if (uVar25 < (ulong)(local_70 + local_1f0)) goto LAB_00242ddd;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_1f8);
        }
        else {
LAB_00242ddd:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_78);
        }
        local_3a0 = &local_390;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_390 = *puVar21;
          uStack_388 = puVar11[3];
        }
        else {
          local_390 = *puVar21;
          local_3a0 = (undefined8 *)*puVar11;
        }
        local_398 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
        local_1d8 = &local_1c8;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_1c8 = *plVar10;
          lStack_1c0 = puVar11[3];
        }
        else {
          local_1c8 = *plVar10;
          local_1d8 = (long *)*puVar11;
        }
        local_1d0 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1d8,(ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_1b8 = &local_1a8;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_1a8 = *plVar10;
          lStack_1a0 = puVar11[3];
        }
        else {
          local_1a8 = *plVar10;
          local_1b8 = (long *)*puVar11;
        }
        local_1b0 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
        local_198 = &local_188;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_188 = *plVar10;
          lStack_180 = puVar11[3];
        }
        else {
          local_188 = *plVar10;
          local_198 = (long *)*puVar11;
        }
        local_190 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_198,(ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_2a0 = &local_290;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_290 = *puVar31;
          lStack_288 = puVar11[3];
        }
        else {
          local_290 = *puVar31;
          local_2a0 = (ulong *)*puVar11;
        }
        local_298 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
        local_428 = &local_418;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_418 = *puVar31;
          uStack_410 = puVar11[3];
        }
        else {
          local_418 = *puVar31;
          local_428 = (ulong *)*puVar11;
        }
        local_420 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_428,(ulong)depthString._M_dataplus._M_p);
        local_220 = &local_210;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_210 = *puVar21;
          uStack_208 = puVar11[3];
        }
        else {
          local_210 = *puVar21;
          local_220 = (undefined8 *)*puVar11;
        }
        local_218 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_270 = *puVar31;
          lStack_268 = plVar10[3];
        }
        else {
          local_270 = *puVar31;
          local_280 = (ulong *)*plVar10;
        }
        local_278 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_98 = local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar27);
        uVar25 = 0xf;
        if (local_280 != &local_270) {
          uVar25 = local_270;
        }
        if (uVar25 < (ulong)(local_90 + local_278)) {
          uVar25 = 0xf;
          if (local_98 != local_88) {
            uVar25 = local_88[0];
          }
          if (uVar25 < (ulong)(local_90 + local_278)) goto LAB_0024329c;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_280);
        }
        else {
LAB_0024329c:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_98);
        }
        local_340 = &local_330;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_330 = *puVar21;
          uStack_328 = puVar11[3];
        }
        else {
          local_330 = *puVar21;
          local_340 = (undefined8 *)*puVar11;
        }
        local_338 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
        local_260 = &local_250;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_250 = *puVar31;
          lStack_248 = puVar11[3];
        }
        else {
          local_250 = *puVar31;
          local_260 = (ulong *)*puVar11;
        }
        local_258 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct((ulong)&local_b8,(char)local_130);
        uVar25 = 0xf;
        if (local_260 != &local_250) {
          uVar25 = local_250;
        }
        if (uVar25 < (ulong)(local_b0 + local_258)) {
          uVar25 = 0xf;
          if (local_b8 != local_a8) {
            uVar25 = local_a8[0];
          }
          if (uVar25 < (ulong)(local_b0 + local_258)) goto LAB_00243809;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_260);
        }
        else {
LAB_00243809:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_b8);
        }
        local_380 = &local_370;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_370 = *puVar31;
          uStack_368 = puVar11[3];
        }
        else {
          local_370 = *puVar31;
          local_380 = (ulong *)*puVar11;
        }
        local_378 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)puVar31 = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_380,(ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_3c0 = &local_3b0;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_3b0 = *puVar21;
          uStack_3a8 = puVar11[3];
        }
        else {
          local_3b0 = *puVar21;
          local_3c0 = (undefined8 *)*puVar11;
        }
        local_3b8 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
        local_178 = &local_168;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_168 = *plVar10;
          lStack_160 = puVar11[3];
        }
        else {
          local_168 = *plVar10;
          local_178 = (long *)*puVar11;
        }
        local_170 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_178,(ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_240 = &local_230;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_230 = *puVar31;
          lStack_228 = puVar11[3];
        }
        else {
          local_230 = *puVar31;
          local_240 = (ulong *)*puVar11;
        }
        local_238 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
        local_320 = &local_310;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_310 = *puVar21;
          uStack_308 = puVar11[3];
        }
        else {
          local_310 = *puVar21;
          local_320 = (undefined8 *)*puVar11;
        }
        local_318 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_320,(ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_400 = &local_3f0;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_3f0 = *puVar31;
          lStack_3e8 = puVar11[3];
        }
        else {
          local_3f0 = *puVar31;
          local_400 = (ulong *)*puVar11;
        }
        local_3f8 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
        local_3e0 = &local_3d0;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_3d0 = *puVar31;
          uStack_3c8 = puVar11[3];
        }
        else {
          local_3d0 = *puVar31;
          local_3e0 = (ulong *)*puVar11;
        }
        local_3d8 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3e0,
                                     (ulong)this->viewName[uVar35]._M_dataplus._M_p);
        local_4a0 = &local_490;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_490 = *puVar31;
          lStack_488 = plVar10[3];
        }
        else {
          local_490 = *puVar31;
          local_4a0 = (ulong *)*plVar10;
        }
        local_498 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        local_450 = &local_440;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_440 = *puVar31;
          lStack_438 = plVar10[3];
        }
        else {
          local_440 = *puVar31;
          local_450 = (ulong *)*plVar10;
        }
        local_448 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct((ulong)&local_d8,(char)local_130);
        uVar25 = 0xf;
        if (local_450 != &local_440) {
          uVar25 = local_440;
        }
        if (uVar25 < (ulong)(local_d0 + local_448)) {
          uVar25 = 0xf;
          if (local_d8 != local_c8) {
            uVar25 = local_c8[0];
          }
          if (uVar25 < (ulong)(local_d0 + local_448)) goto LAB_00243df2;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_450);
        }
        else {
LAB_00243df2:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_d8);
        }
        local_480 = &local_470;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_470 = *plVar10;
          lStack_468 = puVar11[3];
        }
        else {
          local_470 = *plVar10;
          local_480 = (long *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_1._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_1,(ulong)this->viewName[uVar35]._M_dataplus._M_p
                                    );
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_14._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_598;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_598._M_allocated_capacity = *psVar19;
          local_598._8_8_ = plVar10[3];
        }
        else {
          local_598._M_allocated_capacity = *psVar19;
          off = (size_t)*plVar10;
        }
        local_5a0 = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)this->viewName[uVar35]._M_dataplus._M_p);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_2._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar10[3];
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_608._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&loopString,(ulong)local_608._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_598) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_428 != &local_418) {
          operator_delete(local_428);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((long *)outViewID != &local_148) {
          operator_delete((void *)outViewID);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        local_450 = &local_440;
        std::__cxx11::string::_M_construct((ulong)&local_450,(char)local_130);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_470 = *plVar10;
          lStack_468 = puVar11[3];
          local_480 = &local_470;
        }
        else {
          local_470 = *plVar10;
          local_480 = (long *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_480,
                                     (ulong)this->viewName[uVar35]._M_dataplus._M_p);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_1._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_1);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        local_4a0 = &local_490;
        if ((size_type *)*plVar10 == psVar19) {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_14._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_4a0,cVar27);
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          uVar30 = __str_14.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < local_498 + __str_14._M_string_length) {
          uVar35 = 0xf;
          if (local_4a0 != &local_490) {
            uVar35 = local_490;
          }
          if (uVar35 < local_498 + __str_14._M_string_length) goto LAB_00244eaf;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_4a0,0,(char *)0x0,(ulong)__str_14._M_dataplus._M_p);
        }
        else {
LAB_00244eaf:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&__str_14,(ulong)local_4a0);
        }
        off = (size_t)&local_598;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_598._M_allocated_capacity = *puVar31;
          local_598._8_8_ = puVar11[3];
        }
        else {
          local_598._M_allocated_capacity = *puVar31;
          off = (size_t)*puVar11;
        }
        local_5a0 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)puVar31 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&off);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_2._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_2,(ulong)closeLoopString._M_dataplus._M_p);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar10[3];
          local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_608._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&closeLoopString,(ulong)local_608._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_598) {
          operator_delete((void *)off);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
      }
      else {
        local_120 = &local_110;
        std::__cxx11::string::_M_construct((ulong)&local_120,cVar27);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_120);
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_1e8 = *puVar31;
          lStack_1e0 = plVar10[3];
          local_1f8 = &local_1e8;
        }
        else {
          local_1e8 = *puVar31;
          local_1f8 = (ulong *)*plVar10;
        }
        local_1f0 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1f8,(ulong)(local_408->_name)._M_dataplus._M_p);
        local_3a0 = &local_390;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_390 = *puVar21;
          uStack_388 = puVar11[3];
        }
        else {
          local_390 = *puVar21;
          local_3a0 = (undefined8 *)*puVar11;
        }
        local_398 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_1d8 = &local_1c8;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_1c8 = *plVar20;
          lStack_1c0 = plVar10[3];
        }
        else {
          local_1c8 = *plVar20;
          local_1d8 = (long *)*plVar10;
        }
        local_1d0 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_1d8,(ulong)(local_408->_name)._M_dataplus._M_p);
        local_1b8 = &local_1a8;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_1a8 = *plVar20;
          lStack_1a0 = plVar10[3];
        }
        else {
          local_1a8 = *plVar20;
          local_1b8 = (long *)*plVar10;
        }
        local_1b0 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1b8);
        local_198 = &local_188;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_188 = *plVar20;
          lStack_180 = plVar10[3];
        }
        else {
          local_188 = *plVar20;
          local_198 = (long *)*plVar10;
        }
        local_190 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_198,(ulong)depthString._M_dataplus._M_p);
        local_2a0 = &local_290;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_290 = *puVar31;
          lStack_288 = plVar10[3];
        }
        else {
          local_290 = *puVar31;
          local_2a0 = (ulong *)*plVar10;
        }
        local_298 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
        local_428 = &local_418;
        puVar31 = puVar11 + 2;
        local_2c0 = &local_2b0;
        if ((ulong *)*puVar11 == puVar31) {
          local_418 = *puVar31;
          uStack_410 = puVar11[3];
        }
        else {
          local_418 = *puVar31;
          local_428 = (ulong *)*puVar11;
        }
        local_420 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_2c0,cVar27);
        uVar35 = 0xf;
        if (local_428 != &local_418) {
          uVar35 = local_418;
        }
        if (uVar35 < (ulong)(local_2b8 + local_420)) {
          uVar35 = 0xf;
          if (local_2c0 != &local_2b0) {
            uVar35 = local_2b0;
          }
          if (uVar35 < (ulong)(local_2b8 + local_420)) goto LAB_00242e98;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_428);
        }
        else {
LAB_00242e98:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_2c0);
        }
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_210 = *puVar21;
          uStack_208 = puVar11[3];
          local_220 = &local_210;
        }
        else {
          local_210 = *puVar21;
          local_220 = (undefined8 *)*puVar11;
        }
        local_218 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_270 = *puVar31;
          lStack_268 = puVar11[3];
        }
        else {
          local_270 = *puVar31;
          local_280 = (ulong *)*puVar11;
        }
        local_278 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_280,(ulong)(local_408->_name)._M_dataplus._M_p);
        local_340 = &local_330;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_330 = *puVar21;
          uStack_328 = puVar11[3];
        }
        else {
          local_330 = *puVar21;
          local_340 = (undefined8 *)*puVar11;
        }
        local_338 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_260 = &local_250;
        puVar31 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar31) {
          local_250 = *puVar31;
          lStack_248 = plVar10[3];
        }
        else {
          local_250 = *puVar31;
          local_260 = (ulong *)*plVar10;
        }
        local_258 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_260,(ulong)(local_408->_name)._M_dataplus._M_p);
        local_380 = &local_370;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_370 = *puVar31;
          uStack_368 = puVar11[3];
        }
        else {
          local_370 = *puVar31;
          local_380 = (ulong *)*puVar11;
        }
        local_378 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
        local_3c0 = &local_3b0;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_3b0 = *puVar21;
          uStack_3a8 = puVar11[3];
        }
        else {
          local_3b0 = *puVar21;
          local_3c0 = (undefined8 *)*puVar11;
        }
        local_3b8 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3c0,(ulong)depthString._M_dataplus._M_p);
        local_178 = &local_168;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_168 = *plVar20;
          lStack_160 = plVar10[3];
        }
        else {
          local_168 = *plVar20;
          local_178 = (long *)*plVar10;
        }
        local_170 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_240 = &local_230;
        puVar31 = (ulong *)(plVar10 + 2);
        local_2e0 = &local_2d0;
        if ((ulong *)*plVar10 == puVar31) {
          local_230 = *puVar31;
          lStack_228 = plVar10[3];
        }
        else {
          local_230 = *puVar31;
          local_240 = (ulong *)*plVar10;
        }
        local_238 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_2e0,cVar27);
        uVar35 = 0xf;
        if (local_240 != &local_230) {
          uVar35 = local_230;
        }
        if (uVar35 < (ulong)(local_2d8 + local_238)) {
          uVar35 = 0xf;
          if (local_2e0 != &local_2d0) {
            uVar35 = local_2d0;
          }
          if (uVar35 < (ulong)(local_2d8 + local_238)) goto LAB_00243696;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00243696:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_2e0);
        }
        local_320 = &local_310;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_310 = *puVar21;
          uStack_308 = puVar11[3];
        }
        else {
          local_310 = *puVar21;
          local_320 = (undefined8 *)*puVar11;
        }
        local_318 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)puVar21 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_320);
        local_400 = &local_3f0;
        puVar31 = (ulong *)(plVar10 + 2);
        local_300 = &local_2f0;
        if ((ulong *)*plVar10 == puVar31) {
          local_3f0 = *puVar31;
          lStack_3e8 = plVar10[3];
        }
        else {
          local_3f0 = *puVar31;
          local_400 = (ulong *)*plVar10;
        }
        local_3f8 = plVar10[1];
        *plVar10 = (long)puVar31;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_300,(char)local_130);
        uVar35 = 0xf;
        if (local_400 != &local_3f0) {
          uVar35 = local_3f0;
        }
        if (uVar35 < (ulong)(local_2f8 + local_3f8)) {
          uVar35 = 0xf;
          if (local_300 != &local_2f0) {
            uVar35 = local_2f0;
          }
          if (uVar35 < (ulong)(local_2f8 + local_3f8)) goto LAB_0024397c;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_400);
        }
        else {
LAB_0024397c:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_300);
        }
        local_3e0 = &local_3d0;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_3d0 = *puVar31;
          uStack_3c8 = puVar11[3];
        }
        else {
          local_3d0 = *puVar31;
          local_3e0 = (ulong *)*puVar11;
        }
        local_3d8 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)puVar31 = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3e0,(ulong)(local_408->_name)._M_dataplus._M_p);
        local_4a0 = &local_490;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_490 = *puVar31;
          lStack_488 = puVar11[3];
        }
        else {
          local_490 = *puVar31;
          local_4a0 = (ulong *)*puVar11;
        }
        local_498 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        local_450 = &local_440;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_440 = *puVar31;
          lStack_438 = puVar11[3];
        }
        else {
          local_440 = *puVar31;
          local_450 = (ulong *)*puVar11;
        }
        local_448 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_450,(ulong)(local_408->_name)._M_dataplus._M_p);
        local_480 = &local_470;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_470 = *plVar20;
          lStack_468 = plVar10[3];
        }
        else {
          local_470 = *plVar20;
          local_480 = (long *)*plVar10;
        }
        local_478 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_1._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_1,(ulong)(local_408->_name)._M_dataplus._M_p);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_14._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_598;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_598._M_allocated_capacity = *psVar19;
          local_598._8_8_ = plVar10[3];
        }
        else {
          local_598._M_allocated_capacity = *psVar19;
          off = (size_t)*plVar10;
        }
        local_5a0 = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)(local_408->_name)._M_dataplus._M_p);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_2._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar10[3];
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_608._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&loopString,(ulong)local_608._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_598) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_428 != &local_418) {
          operator_delete(local_428);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120);
        }
        local_450 = &local_440;
        std::__cxx11::string::_M_construct((ulong)&local_450,(char)local_130);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_470 = *plVar10;
          lStack_468 = puVar11[3];
          local_480 = &local_470;
        }
        else {
          local_470 = *plVar10;
          local_480 = (long *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_480,(ulong)(local_408->_name)._M_dataplus._M_p);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1.field_2._8_8_ = plVar10[3];
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_1._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_1);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        local_4a0 = &local_490;
        if ((size_type *)*plVar10 == psVar19) {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_14._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_4a0,cVar27);
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          uVar30 = __str_14.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < local_498 + __str_14._M_string_length) {
          uVar35 = 0xf;
          if (local_4a0 != &local_490) {
            uVar35 = local_490;
          }
          if (uVar35 < local_498 + __str_14._M_string_length) goto LAB_00244694;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_4a0,0,(char *)0x0,(ulong)__str_14._M_dataplus._M_p);
        }
        else {
LAB_00244694:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&__str_14,(ulong)local_4a0);
        }
        off = (size_t)&local_598;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_598._M_allocated_capacity = *puVar31;
          local_598._8_8_ = puVar11[3];
        }
        else {
          local_598._M_allocated_capacity = *puVar31;
          off = (size_t)*puVar11;
        }
        local_5a0 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)puVar31 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&off);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_2._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_2,(ulong)closeLoopString._M_dataplus._M_p);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar10[3];
          local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_608._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&closeLoopString,(string *)&local_608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_598) {
          operator_delete((void *)off);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
      }
      paVar24 = &local_608.field_2;
      genDependentAggLoopString
                (&local_608,this,local_408,sVar18,local_460,(dyn_bitset *)local_430,maxDepth,
                 &productString);
      std::__cxx11::string::_M_append((char *)&loopString,(ulong)local_608._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != paVar24) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      std::operator+(&__str_2,&productString,&loopString);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_2,(ulong)closeLoopString._M_dataplus._M_p);
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        local_608.field_2._M_allocated_capacity = *psVar19;
        local_608.field_2._8_8_ = plVar10[3];
        local_608._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_608.field_2._M_allocated_capacity = *psVar19;
        local_608._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_608._M_string_length = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_608._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != paVar24) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      pvVar14 = (this->newAggregateRegister).
                super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar33 = pvVar14[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar14[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                   _M_impl.super__Vector_impl_data + 8) != pAVar33) {
        uVar35 = 0;
        do {
          if (pAVar33[uVar35].postLoopAgg == true) {
            __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
            std::__cxx11::string::_M_construct((ulong)&__str_14,cVar27);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
            off = (size_t)&local_598;
            puVar31 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar31) {
              local_598._M_allocated_capacity = *puVar31;
              local_598._8_8_ = puVar11[3];
            }
            else {
              local_598._M_allocated_capacity = *puVar31;
              off = (size_t)*puVar11;
            }
            local_5a0 = puVar11[1];
            *puVar11 = puVar31;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            uVar25 = this->aggregateCounter;
            cVar28 = '\x01';
            if (9 < uVar25) {
              uVar13 = uVar25;
              cVar26 = '\x04';
              do {
                cVar28 = cVar26;
                if (uVar13 < 100) {
                  cVar28 = cVar28 + -2;
                  goto LAB_00245464;
                }
                if (uVar13 < 1000) {
                  cVar28 = cVar28 + -1;
                  goto LAB_00245464;
                }
                if (uVar13 < 10000) goto LAB_00245464;
                bVar8 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar26 = cVar28 + '\x04';
              } while (bVar8);
              cVar28 = cVar28 + '\x01';
            }
LAB_00245464:
            __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
            std::__cxx11::string::_M_construct((ulong)&__str_1,cVar28);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar25);
            uVar30 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)off != &local_598) {
              uVar30 = local_598._M_allocated_capacity;
            }
            if ((ulong)uVar30 < __str_1._M_string_length + local_5a0) {
              uVar30 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                uVar30 = __str_1.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar30 < __str_1._M_string_length + local_5a0) goto LAB_002454f7;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,off);
            }
            else {
LAB_002454f7:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&off,(ulong)__str_1._M_dataplus._M_p);
            }
            __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
            psVar19 = puVar11 + 2;
            if ((size_type *)*puVar11 == psVar19) {
              __str_2.field_2._M_allocated_capacity = *psVar19;
              __str_2.field_2._8_8_ = puVar11[3];
            }
            else {
              __str_2.field_2._M_allocated_capacity = *psVar19;
              __str_2._M_dataplus._M_p = (pointer)*puVar11;
            }
            __str_2._M_string_length = puVar11[1];
            *puVar11 = psVar19;
            puVar11[1] = 0;
            *(char *)psVar19 = '\0';
            plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
            psVar19 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar19) {
              local_608.field_2._M_allocated_capacity = *psVar19;
              local_608.field_2._8_8_ = plVar10[3];
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
            }
            else {
              local_608.field_2._M_allocated_capacity = *psVar19;
              local_608._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_608._M_string_length = plVar10[1];
            *plVar10 = (long)psVar19;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_608._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
              operator_delete(local_608._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
              operator_delete(__str_1._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)off != &local_598) {
              operator_delete((void *)off);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
              operator_delete(__str_14._M_dataplus._M_p);
            }
            pAVar33 = pAVar33 + uVar35;
            uVar25 = (pAVar33->previous).first;
            uVar13 = ((long)(this->depListOfLoops).
                            super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->depListOfLoops).
                            super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
            paVar24 = &__str_2.field_2;
            if (uVar25 < uVar13) {
              uVar25 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_460].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar25 * 0x18)
                                 + (pAVar33->previous).second * 8);
              cVar28 = '\x01';
              if (9 < uVar25) {
                uVar13 = uVar25;
                cVar26 = '\x04';
                do {
                  cVar28 = cVar26;
                  if (uVar13 < 100) {
                    cVar28 = cVar28 + -2;
                    goto LAB_002456ed;
                  }
                  if (uVar13 < 1000) {
                    cVar28 = cVar28 + -1;
                    goto LAB_002456ed;
                  }
                  if (uVar13 < 10000) goto LAB_002456ed;
                  bVar8 = 99999 < uVar13;
                  uVar13 = uVar13 / 10000;
                  cVar26 = cVar28 + '\x04';
                } while (bVar8);
                cVar28 = cVar28 + '\x01';
              }
LAB_002456ed:
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_608,cVar28);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_608._M_dataplus._M_p,(uint)local_608._M_string_length,uVar25);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &off,"aggregateRegister[",&local_608);
              plVar10 = (long *)std::__cxx11::string::append((char *)&off);
              psVar19 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar19) {
                __str_2.field_2._M_allocated_capacity = *psVar19;
                __str_2.field_2._8_8_ = plVar10[3];
                __str_2._M_dataplus._M_p = (pointer)paVar24;
              }
              else {
                __str_2.field_2._M_allocated_capacity = *psVar19;
                __str_2._M_dataplus._M_p = (pointer)*plVar10;
              }
              __str_2._M_string_length = plVar10[1];
              *plVar10 = (long)psVar19;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)__str_2._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != paVar24) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)off != &local_598) {
                operator_delete((void *)off);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p);
              }
              uVar13 = ((long)(this->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
            }
            uVar25 = (pAVar33->postLoop).first;
            if (uVar25 < uVar13) {
              uVar25 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_460].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar25 * 0x18)
                                 + (pAVar33->postLoop).second * 8);
              cVar28 = '\x01';
              if (9 < uVar25) {
                uVar13 = uVar25;
                cVar26 = '\x04';
                do {
                  cVar28 = cVar26;
                  if (uVar13 < 100) {
                    cVar28 = cVar28 + -2;
                    goto LAB_00245885;
                  }
                  if (uVar13 < 1000) {
                    cVar28 = cVar28 + -1;
                    goto LAB_00245885;
                  }
                  if (uVar13 < 10000) goto LAB_00245885;
                  bVar8 = 99999 < uVar13;
                  uVar13 = uVar13 / 10000;
                  cVar26 = cVar28 + '\x04';
                } while (bVar8);
                cVar28 = cVar28 + '\x01';
              }
LAB_00245885:
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_608,cVar28);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_608._M_dataplus._M_p,(uint)local_608._M_string_length,uVar25);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &off,"aggregateRegister[",&local_608);
              plVar10 = (long *)std::__cxx11::string::append((char *)&off);
              psVar19 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar19) {
                __str_2.field_2._M_allocated_capacity = *psVar19;
                __str_2.field_2._8_8_ = plVar10[3];
                __str_2._M_dataplus._M_p = (pointer)paVar24;
              }
              else {
                __str_2.field_2._M_allocated_capacity = *psVar19;
                __str_2._M_dataplus._M_p = (pointer)*plVar10;
              }
              __str_2._M_string_length = plVar10[1];
              *plVar10 = (long)psVar19;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)__str_2._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != paVar24) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)off != &local_598) {
                operator_delete((void *)off);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p);
              }
            }
            std::__cxx11::string::pop_back();
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            sVar12 = this->aggregateCounter;
            *(size_t *)
             (*(long *)&(this->depAggregateRemapping).
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar18].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + uVar35 * 8) = sVar12;
            this->aggregateCounter = sVar12 + 1;
            pvVar14 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar35 = uVar35 + 1;
          pAVar33 = pvVar14[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar35 < (ulong)(((long)*(pointer *)
                                          ((long)&pvVar14[sVar18].
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pAVar33 >> 4) * 0x6db6db6db6db6db7));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)loopString._M_dataplus._M_p != &loopString.field_2) {
        operator_delete(loopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)productString._M_dataplus._M_p != &productString.field_2) {
        operator_delete(productString._M_dataplus._M_p);
      }
      local_128 = local_128 + 1;
      lVar23 = *(long *)((long)local_138 + 0x18);
    } while (local_128 < (ulong)(*(long *)((long)local_138 + 0x20) - lVar23 >> 3));
    pvVar14 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar23 = *(long *)((long)&(pvVar14->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)
                            ._M_impl.super__Vector_impl_data + local_458 * 8);
  if (*(long *)((long)&(pvVar14->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                       _M_impl.super__Vector_impl_data + local_458 * 8 + 8) == lVar23)
  goto LAB_00246a9a;
  pAVar22 = (pointer)this->aggregateCounter;
  cVar27 = (char)local_200;
  cVar28 = (char)local_460;
  uVar35 = 0;
  local_430 = pAVar22;
  do {
    if ((*(char *)(lVar23 + uVar35 * 0x70 + 0x40) == '\0') &&
       (puVar31 = (ulong *)(lVar23 + uVar35 * 0x70), *(char *)((long)puVar31 + 0x41) == '\0')) {
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_608,(cVar27 + cVar28) * '\x03' + '\t');
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_608);
      closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        closeLoopString.field_2._M_allocated_capacity = *psVar19;
        closeLoopString.field_2._8_8_ = plVar10[3];
      }
      else {
        closeLoopString.field_2._M_allocated_capacity = *psVar19;
        closeLoopString._M_dataplus._M_p = (pointer)*plVar10;
      }
      closeLoopString._M_string_length = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar25 = this->aggregateCounter;
      cVar26 = '\x01';
      if (9 < uVar25) {
        uVar13 = uVar25;
        cVar7 = '\x04';
        do {
          cVar26 = cVar7;
          if (uVar13 < 100) {
            cVar26 = cVar26 + -2;
            goto LAB_00245bc4;
          }
          if (uVar13 < 1000) {
            cVar26 = cVar26 + -1;
            goto LAB_00245bc4;
          }
          if (uVar13 < 10000) goto LAB_00245bc4;
          bVar8 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar7 = cVar26 + '\x04';
        } while (bVar8);
        cVar26 = cVar26 + '\x01';
      }
LAB_00245bc4:
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_2,cVar26);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar25);
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        uVar30 = closeLoopString.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length) {
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          uVar30 = __str_2.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length)
        goto LAB_00245c3f;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&__str_2,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p);
      }
      else {
LAB_00245c3f:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
      }
      psVar19 = puVar11 + 2;
      if ((size_type *)*puVar11 == psVar19) {
        loopString.field_2._M_allocated_capacity = *psVar19;
        loopString.field_2._8_8_ = puVar11[3];
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
      }
      else {
        loopString.field_2._M_allocated_capacity = *psVar19;
        loopString._M_dataplus._M_p = (pointer)*puVar11;
      }
      loopString._M_string_length = puVar11[1];
      *puVar11 = psVar19;
      puVar11[1] = 0;
      *(char *)psVar19 = '\0';
      plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
      productString._M_dataplus._M_p = (pointer)&productString.field_2;
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        productString.field_2._M_allocated_capacity = *psVar19;
        productString.field_2._8_8_ = plVar10[3];
      }
      else {
        productString.field_2._M_allocated_capacity = *psVar19;
        productString._M_dataplus._M_p = (pointer)*plVar10;
      }
      productString._M_string_length = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)productString._M_dataplus._M_p != &productString.field_2) {
        operator_delete(productString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)loopString._M_dataplus._M_p != &loopString.field_2) {
        operator_delete(loopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      if (*puVar31 <
          (ulong)(((long)(this->depListOfLoops).
                         super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->depListOfLoops).
                         super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97)) {
        uVar25 = *(ulong *)(*(long *)&(this->depAggregateRemapping).
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[*puVar31].
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data + puVar31[1] * 8);
        cVar26 = '\x01';
        if (9 < uVar25) {
          uVar13 = uVar25;
          cVar7 = '\x04';
          do {
            cVar26 = cVar7;
            if (uVar13 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_00245e33;
            }
            if (uVar13 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_00245e33;
            }
            if (uVar13 < 10000) goto LAB_00245e33;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar26 + '\x04';
          } while (bVar8);
          cVar26 = cVar26 + '\x01';
        }
LAB_00245e33:
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        std::__cxx11::string::_M_construct((ulong)&productString,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar25);
        std::operator+(&closeLoopString,"aggregateRegister[",&productString);
        plVar10 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = plVar10[3];
          loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        loopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
      }
      if ((char)puVar31[2] == '\x01') {
        uVar25 = *(ulong *)(*(long *)((long)&(((this->depLocalProductRemapping).
                                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             )._M_impl.super__Vector_impl_data + local_458 * 8) +
                           puVar31[3] * 8);
        cVar26 = '\x01';
        if (9 < uVar25) {
          uVar13 = uVar25;
          cVar7 = '\x04';
          do {
            cVar26 = cVar7;
            if (uVar13 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_00245fcb;
            }
            if (uVar13 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_00245fcb;
            }
            if (uVar13 < 10000) goto LAB_00245fcb;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar26 + '\x04';
          } while (bVar8);
          cVar26 = cVar26 + '\x01';
        }
LAB_00245fcb:
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        std::__cxx11::string::_M_construct((ulong)&productString,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar25);
        std::operator+(&closeLoopString,"localRegister[",&productString);
        plVar10 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = plVar10[3];
          loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        loopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
      }
      paVar24 = &loopString.field_2;
      if (*(char *)((long)puVar31 + 0x51) == '\x01') {
        std::operator+(&local_608,"aggregates_",this->viewName + puVar31[0xb]);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_608);
        closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          closeLoopString.field_2._M_allocated_capacity = *psVar19;
          closeLoopString.field_2._8_8_ = plVar10[3];
        }
        else {
          closeLoopString.field_2._M_allocated_capacity = *psVar19;
          closeLoopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        closeLoopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar25 = puVar31[0xc];
        cVar26 = '\x01';
        if (9 < uVar25) {
          uVar13 = uVar25;
          cVar7 = '\x04';
          do {
            cVar26 = cVar7;
            if (uVar13 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_002461c6;
            }
            if (uVar13 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_002461c6;
            }
            if (uVar13 < 10000) goto LAB_002461c6;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar26 + '\x04';
          } while (bVar8);
          cVar26 = cVar26 + '\x01';
        }
LAB_002461c6:
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_2,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar25);
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          uVar30 = closeLoopString.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length) {
          uVar30 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            uVar30 = __str_2.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar30 < __str_2._M_string_length + closeLoopString._M_string_length)
          goto LAB_00246241;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&__str_2,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p
                              );
        }
        else {
LAB_00246241:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
        }
        psVar19 = puVar11 + 2;
        if ((size_type *)*puVar11 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = puVar11[3];
          loopString._M_dataplus._M_p = (pointer)paVar24;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*puVar11;
        }
        loopString._M_string_length = puVar11[1];
        *puVar11 = psVar19;
        puVar11[1] = 0;
        *(char *)psVar19 = '\0';
        plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString.field_2._8_8_ = plVar10[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString._M_dataplus._M_p = (pointer)*plVar10;
        }
        productString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != paVar24) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
      }
      if (puVar31[6] <
          (ulong)(((long)(this->depListOfLoops).
                         super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->depListOfLoops).
                         super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97)) {
        uVar25 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[local_460]
                                                .
                                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data + puVar31[6] * 0x18
                                     ) + puVar31[7] * 8);
        cVar26 = '\x01';
        if (9 < uVar25) {
          uVar13 = uVar25;
          cVar7 = '\x04';
          do {
            cVar26 = cVar7;
            if (uVar13 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_0024644e;
            }
            if (uVar13 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_0024644e;
            }
            if (uVar13 < 10000) goto LAB_0024644e;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar26 + '\x04';
          } while (bVar8);
          cVar26 = cVar26 + '\x01';
        }
LAB_0024644e:
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        std::__cxx11::string::_M_construct((ulong)&productString,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar25);
        std::operator+(&closeLoopString,"aggregateRegister[",&productString);
        plVar10 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = plVar10[3];
          loopString._M_dataplus._M_p = (pointer)paVar24;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        loopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != paVar24) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      sVar18 = this->aggregateCounter;
      *(size_t *)
       (*(long *)((long)&(((this->depAggregateRemapping).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + local_458 * 8) + uVar35 * 8) = sVar18;
      pAVar22 = (pointer)(sVar18 + 1);
      this->aggregateCounter = (size_t)pAVar22;
      pvVar14 = (this->newAggregateRegister).
                super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar35 = uVar35 + 1;
    lVar23 = *(long *)((long)&(pvVar14->
                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)._M_impl
                              .super__Vector_impl_data + local_458 * 8);
  } while (uVar35 < (ulong)((*(long *)((long)&(pvVar14->
                                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                              )._M_impl.super__Vector_impl_data + local_458 * 8 + 8)
                             - lVar23 >> 4) * 0x6db6db6db6db6db7));
  if (pAVar22 <= local_430) goto LAB_00246a9a;
  cVar27 = (char)local_200 + '\x02' + (char)local_460;
  if (local_200 == 0) {
    cVar27 = (char)local_460 + '\x03';
  }
  off = (size_t)&local_598;
  std::__cxx11::string::_M_construct((ulong)&off,cVar27 * '\x03');
  plVar10 = (long *)std::__cxx11::string::append((char *)&off);
  psVar19 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar19) {
    __str_2.field_2._M_allocated_capacity = *psVar19;
    __str_2.field_2._8_8_ = plVar10[3];
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
  }
  else {
    __str_2.field_2._M_allocated_capacity = *psVar19;
    __str_2._M_dataplus._M_p = (pointer)*plVar10;
  }
  __str_2._M_string_length = plVar10[1];
  *plVar10 = (long)psVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  cVar27 = '\x01';
  if ((pointer)0x9 < local_430) {
    pAVar22 = local_430;
    cVar28 = '\x04';
    do {
      cVar27 = cVar28;
      if (pAVar22 < (pointer)0x64) {
        cVar27 = cVar27 + -2;
        goto LAB_002466e4;
      }
      if (pAVar22 < (pointer)0x3e8) {
        cVar27 = cVar27 + -1;
        goto LAB_002466e4;
      }
      if (pAVar22 < (pointer)0x2710) goto LAB_002466e4;
      bVar8 = (pointer)0x1869f < pAVar22;
      pAVar22 = (pointer)((ulong)pAVar22 / 10000);
      cVar28 = cVar27 + '\x04';
    } while (bVar8);
    cVar27 = cVar27 + '\x01';
  }
LAB_002466e4:
  paVar24 = &__str_14.field_2;
  __str_14._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct((ulong)&__str_14,cVar27);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_14._M_dataplus._M_p,(uint)__str_14._M_string_length,(unsigned_long)local_430);
  uVar30 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
    uVar30 = __str_2.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < __str_14._M_string_length + __str_2._M_string_length) {
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_14._M_dataplus._M_p != paVar24) {
      uVar30 = __str_14.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < __str_14._M_string_length + __str_2._M_string_length) goto LAB_0024676b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&__str_14,0,(char *)0x0,(ulong)__str_2._M_dataplus._M_p);
  }
  else {
LAB_0024676b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&__str_2,(ulong)__str_14._M_dataplus._M_p);
  }
  psVar19 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar19) {
    local_608.field_2._M_allocated_capacity = *psVar19;
    local_608.field_2._8_8_ = puVar11[3];
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  }
  else {
    local_608.field_2._M_allocated_capacity = *psVar19;
    local_608._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_608._M_string_length = puVar11[1];
  *puVar11 = psVar19;
  puVar11[1] = 0;
  *(char *)psVar19 = '\0';
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_608);
  psVar19 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar19) {
    closeLoopString.field_2._M_allocated_capacity = *psVar19;
    closeLoopString.field_2._8_8_ = plVar10[3];
    closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
  }
  else {
    closeLoopString.field_2._M_allocated_capacity = *psVar19;
    closeLoopString._M_dataplus._M_p = (pointer)*plVar10;
  }
  closeLoopString._M_string_length = plVar10[1];
  *plVar10 = (long)psVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar35 = this->aggregateCounter - (long)local_430;
  cVar27 = '\x01';
  if (9 < uVar35) {
    uVar25 = uVar35;
    cVar28 = '\x04';
    do {
      cVar27 = cVar28;
      if (uVar25 < 100) {
        cVar27 = cVar27 + -2;
        goto LAB_0024688b;
      }
      if (uVar25 < 1000) {
        cVar27 = cVar27 + -1;
        goto LAB_0024688b;
      }
      if (uVar25 < 10000) goto LAB_0024688b;
      bVar8 = 99999 < uVar25;
      uVar25 = uVar25 / 10000;
      cVar28 = cVar27 + '\x04';
    } while (bVar8);
    cVar27 = cVar27 + '\x01';
  }
LAB_0024688b:
  paVar1 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&__str_1,cVar27);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar35);
  uVar30 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
    uVar30 = closeLoopString.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < __str_1._M_string_length + closeLoopString._M_string_length) {
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      uVar30 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < __str_1._M_string_length + closeLoopString._M_string_length)
    goto LAB_00246915;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&__str_1,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p);
  }
  else {
LAB_00246915:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&closeLoopString,(ulong)__str_1._M_dataplus._M_p);
  }
  psVar19 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar19) {
    loopString.field_2._M_allocated_capacity = *psVar19;
    loopString.field_2._8_8_ = puVar11[3];
    loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
  }
  else {
    loopString.field_2._M_allocated_capacity = *psVar19;
    loopString._M_dataplus._M_p = (pointer)*puVar11;
  }
  loopString._M_string_length = puVar11[1];
  *puVar11 = psVar19;
  puVar11[1] = 0;
  *(char *)psVar19 = '\0';
  plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
  psVar19 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar19) {
    productString.field_2._M_allocated_capacity = *psVar19;
    productString.field_2._8_8_ = plVar10[3];
    productString._M_dataplus._M_p = (pointer)&productString.field_2;
  }
  else {
    productString.field_2._M_allocated_capacity = *psVar19;
    productString._M_dataplus._M_p = (pointer)*plVar10;
  }
  productString._M_string_length = plVar10[1];
  *plVar10 = (long)psVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)resetString,(ulong)productString._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)productString._M_dataplus._M_p != &productString.field_2) {
    operator_delete(productString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)loopString._M_dataplus._M_p != &loopString.field_2) {
    operator_delete(loopString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar1) {
    operator_delete(__str_1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
    operator_delete(closeLoopString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_14._M_dataplus._M_p != paVar24) {
    operator_delete(__str_14._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
    operator_delete(__str_2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)off != &local_598) {
    operator_delete((void *)off);
  }
LAB_00246a9a:
  local_138 = (pointer)((long)local_138 + 0x30);
  v_id = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                   ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_138,0);
  outViewID = v_id;
  if (v_id != 0xffffffffffffffff) {
    local_200 = local_200 + local_460;
    local_460 = local_460 + 1;
    do {
      pVVar15 = QueryCompiler::getView
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,v_id);
      closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&closeLoopString,"");
      uVar35 = 0;
      do {
        uVar13 = uVar35 >> 6;
        uVar25 = 1L << ((byte)uVar35 & 0x3f);
        if (((pVVar15->_fVars).super__Base_bitset<2UL>._M_w[uVar13] >> (uVar35 & 0x3f) & 1) != 0) {
          if (((local_408->_bag).super__Base_bitset<2UL>._M_w[uVar13] & uVar25) == 0) {
            psVar5 = this->incomingViews[outViewID].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (psVar34 = this->incomingViews[outViewID].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; psVar34 != psVar5;
                psVar34 = psVar34 + 1) {
              pVVar17 = QueryCompiler::getView
                                  ((this->_qc).
                                   super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,*psVar34);
              if (((pVVar17->_fVars).super__Base_bitset<2UL>._M_w[uVar13] & uVar25) != 0) {
                local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
                pcVar4 = this->viewName[*psVar34]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_608,pcVar4,
                           pcVar4 + this->viewName[*psVar34]._M_string_length);
                std::__cxx11::string::append((char *)&local_608);
                pAVar16 = TreeDecomposition::getAttribute
                                    ((this->_td).
                                     super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,uVar35);
                plVar10 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_608,
                                             (ulong)(pAVar16->_name)._M_dataplus._M_p);
                psVar19 = (size_type *)(plVar10 + 2);
                if ((size_type *)*plVar10 == psVar19) {
                  loopString.field_2._M_allocated_capacity = *psVar19;
                  loopString.field_2._8_8_ = plVar10[3];
                  loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
                }
                else {
                  loopString.field_2._M_allocated_capacity = *psVar19;
                  loopString._M_dataplus._M_p = (pointer)*plVar10;
                }
                loopString._M_string_length = plVar10[1];
                *plVar10 = (long)psVar19;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
                psVar19 = (size_type *)(plVar10 + 2);
                if ((size_type *)*plVar10 == psVar19) {
                  productString.field_2._M_allocated_capacity = *psVar19;
                  productString.field_2._8_8_ = plVar10[3];
                  productString._M_dataplus._M_p = (pointer)&productString.field_2;
                }
                else {
                  productString.field_2._M_allocated_capacity = *psVar19;
                  productString._M_dataplus._M_p = (pointer)*plVar10;
                }
                productString._M_string_length = plVar10[1];
                *plVar10 = (long)psVar19;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&closeLoopString,(ulong)productString._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)productString._M_dataplus._M_p != &productString.field_2) {
                  operator_delete(productString._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)loopString._M_dataplus._M_p != &loopString.field_2) {
                  operator_delete(loopString._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608._M_dataplus._M_p != &local_608.field_2) goto LAB_00246cfb;
                break;
              }
            }
          }
          else {
            local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
            pcVar4 = (local_408->_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_608,pcVar4,pcVar4 + (local_408->_name)._M_string_length);
            std::__cxx11::string::append((char *)&local_608);
            pAVar16 = TreeDecomposition::getAttribute
                                ((this->_td).
                                 super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,uVar35);
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_608,(ulong)(pAVar16->_name)._M_dataplus._M_p
                                        );
            psVar19 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar19) {
              loopString.field_2._M_allocated_capacity = *psVar19;
              loopString.field_2._8_8_ = plVar10[3];
              loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
            }
            else {
              loopString.field_2._M_allocated_capacity = *psVar19;
              loopString._M_dataplus._M_p = (pointer)*plVar10;
            }
            loopString._M_string_length = plVar10[1];
            *plVar10 = (long)psVar19;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
            psVar19 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar19) {
              productString.field_2._M_allocated_capacity = *psVar19;
              productString.field_2._8_8_ = plVar10[3];
              productString._M_dataplus._M_p = (pointer)&productString.field_2;
            }
            else {
              productString.field_2._M_allocated_capacity = *psVar19;
              productString._M_dataplus._M_p = (pointer)*plVar10;
            }
            productString._M_string_length = plVar10[1];
            *plVar10 = (long)psVar19;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&closeLoopString,(ulong)productString._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)productString._M_dataplus._M_p != &productString.field_2) {
              operator_delete(productString._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopString._M_dataplus._M_p != &loopString.field_2) {
              operator_delete(loopString._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
LAB_00246cfb:
              operator_delete(local_608._M_dataplus._M_p);
            }
          }
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != 100);
      std::__cxx11::string::pop_back();
      sVar18 = outViewID;
      local_430 = (pointer)(local_200 + 3 + (ulong)(local_460 < maxDepth));
      cVar27 = (char)local_430 * '\x03';
      if (this->_requireHashing[outViewID] == false) {
        local_3e0 = &local_3d0;
        std::__cxx11::string::_M_construct((ulong)&local_3e0,cVar27);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3e0,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_490 = *puVar31;
          lStack_488 = puVar11[3];
          local_4a0 = &local_490;
        }
        else {
          local_490 = *puVar31;
          local_4a0 = (ulong *)*puVar11;
        }
        local_498 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        local_450 = &local_440;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_440 = *puVar31;
          lStack_438 = puVar11[3];
        }
        else {
          local_440 = *puVar31;
          local_450 = (ulong *)*puVar11;
        }
        local_448 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_450,(ulong)closeLoopString._M_dataplus._M_p);
        local_480 = &local_470;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_470 = *plVar10;
          lStack_468 = puVar11[3];
        }
        else {
          local_470 = *plVar10;
          local_480 = (long *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        local_400 = &local_3f0;
        if ((size_type *)*plVar10 == psVar19) {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_1._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_400,cVar27);
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar30 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < local_3f8 + __str_1._M_string_length) {
          uVar35 = 0xf;
          if (local_400 != &local_3f0) {
            uVar35 = local_3f0;
          }
          if (uVar35 < local_3f8 + __str_1._M_string_length) goto LAB_002473bb;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_400,0,(char *)0x0,(ulong)__str_1._M_dataplus._M_p);
        }
        else {
LAB_002473bb:
          puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&__str_1,(ulong)local_400)
          ;
        }
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar19 = puVar11 + 2;
        if ((size_type *)*puVar11 == psVar19) {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14.field_2._8_8_ = puVar11[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14._M_dataplus._M_p = (pointer)*puVar11;
        }
        __str_14._M_string_length = puVar11[1];
        *puVar11 = psVar19;
        puVar11[1] = 0;
        *(char *)psVar19 = '\0';
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_598;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_598._M_allocated_capacity = *puVar31;
          local_598._8_8_ = puVar11[3];
        }
        else {
          local_598._M_allocated_capacity = *puVar31;
          off = (size_t)*puVar11;
        }
        local_5a0 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_2._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar10[3];
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_608._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_608,
                                     (ulong)this->viewName[sVar18]._M_dataplus._M_p);
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = plVar10[3];
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        loopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString.field_2._8_8_ = plVar10[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString._M_dataplus._M_p = (pointer)*plVar10;
        }
        productString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_598) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        puVar31 = local_3e0;
        if (local_3e0 != &local_3d0) goto LAB_002486a0;
      }
      else {
        local_120 = &local_110;
        std::__cxx11::string::_M_construct((ulong)&local_120,cVar27);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_120,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        local_1f8 = &local_1e8;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_1e8 = *puVar31;
          lStack_1e0 = puVar11[3];
        }
        else {
          local_1e8 = *puVar31;
          local_1f8 = (ulong *)*puVar11;
        }
        local_1f0 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
        local_3a0 = &local_390;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_390 = *puVar21;
          uStack_388 = puVar11[3];
        }
        else {
          local_390 = *puVar21;
          local_3a0 = (undefined8 *)*puVar11;
        }
        local_398 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3a0,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        local_1d8 = &local_1c8;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_1c8 = *plVar10;
          lStack_1c0 = puVar11[3];
        }
        else {
          local_1c8 = *plVar10;
          local_1d8 = (long *)*puVar11;
        }
        local_1d0 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
        local_1b8 = &local_1a8;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_1a8 = *plVar10;
          lStack_1a0 = puVar11[3];
        }
        else {
          local_1a8 = *plVar10;
          local_1b8 = (long *)*puVar11;
        }
        local_1b0 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1b8,(ulong)closeLoopString._M_dataplus._M_p);
        local_198 = &local_188;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_188 = *plVar10;
          lStack_180 = puVar11[3];
        }
        else {
          local_188 = *plVar10;
          local_198 = (long *)*puVar11;
        }
        local_190 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_2a0 = &local_290;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_290 = *puVar31;
          lStack_288 = puVar11[3];
        }
        else {
          local_290 = *puVar31;
          local_2a0 = (ulong *)*puVar11;
        }
        local_298 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_2c0 = &local_2b0;
        std::__cxx11::string::_M_construct((ulong)&local_2c0,cVar27);
        uVar35 = 0xf;
        if (local_2a0 != &local_290) {
          uVar35 = local_290;
        }
        if (uVar35 < (ulong)(local_2b8 + local_298)) {
          uVar35 = 0xf;
          if (local_2c0 != &local_2b0) {
            uVar35 = local_2b0;
          }
          if (uVar35 < (ulong)(local_2b8 + local_298)) goto LAB_002474e7;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
        }
        else {
LAB_002474e7:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0);
        }
        local_428 = &local_418;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_418 = *puVar31;
          uStack_410 = puVar11[3];
        }
        else {
          local_418 = *puVar31;
          local_428 = (ulong *)*puVar11;
        }
        local_420 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)puVar31 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
        local_220 = &local_210;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_210 = *puVar21;
          uStack_208 = puVar11[3];
        }
        else {
          local_210 = *puVar21;
          local_220 = (undefined8 *)*puVar11;
        }
        local_218 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_220,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        local_280 = &local_270;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_270 = *puVar31;
          lStack_268 = puVar11[3];
        }
        else {
          local_270 = *puVar31;
          local_280 = (ulong *)*puVar11;
        }
        local_278 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
        local_340 = &local_330;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_330 = *puVar21;
          uStack_328 = puVar11[3];
        }
        else {
          local_330 = *puVar21;
          local_340 = (undefined8 *)*puVar11;
        }
        local_338 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_340,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        local_260 = &local_250;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_250 = *puVar31;
          lStack_248 = puVar11[3];
        }
        else {
          local_250 = *puVar31;
          local_260 = (ulong *)*puVar11;
        }
        local_258 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
        local_380 = &local_370;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_370 = *puVar31;
          uStack_368 = puVar11[3];
        }
        else {
          local_370 = *puVar31;
          local_380 = (ulong *)*puVar11;
        }
        local_378 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct((ulong)&local_2e0,cVar27 + '\x03');
        uVar35 = 0xf;
        if (local_380 != &local_370) {
          uVar35 = local_370;
        }
        if (uVar35 < (ulong)(local_2d8 + local_378)) {
          uVar35 = 0xf;
          if (local_2e0 != &local_2d0) {
            uVar35 = local_2d0;
          }
          if (uVar35 < (ulong)(local_2d8 + local_378)) goto LAB_00247b9a;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_380);
        }
        else {
LAB_00247b9a:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_2e0);
        }
        local_3c0 = &local_3b0;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_3b0 = *puVar21;
          uStack_3a8 = puVar11[3];
        }
        else {
          local_3b0 = *puVar21;
          local_3c0 = (undefined8 *)*puVar11;
        }
        local_3b8 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
        local_178 = &local_168;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_168 = *plVar10;
          lStack_160 = puVar11[3];
        }
        else {
          local_168 = *plVar10;
          local_178 = (long *)*puVar11;
        }
        local_170 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_178,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        local_240 = &local_230;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_230 = *puVar31;
          lStack_228 = puVar11[3];
        }
        else {
          local_230 = *puVar31;
          local_240 = (ulong *)*puVar11;
        }
        local_238 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
        local_320 = &local_310;
        puVar21 = puVar11 + 2;
        if ((undefined8 *)*puVar11 == puVar21) {
          local_310 = *puVar21;
          uStack_308 = puVar11[3];
        }
        else {
          local_310 = *puVar21;
          local_320 = (undefined8 *)*puVar11;
        }
        local_318 = puVar11[1];
        *puVar11 = puVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_320,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        local_400 = &local_3f0;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_3f0 = *puVar31;
          lStack_3e8 = puVar11[3];
        }
        else {
          local_3f0 = *puVar31;
          local_400 = (ulong *)*puVar11;
        }
        local_3f8 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_3d0 = *puVar31;
          uStack_3c8 = puVar11[3];
          local_3e0 = &local_3d0;
        }
        else {
          local_3d0 = *puVar31;
          local_3e0 = (ulong *)*puVar11;
        }
        local_3d8 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_300 = &local_2f0;
        std::__cxx11::string::_M_construct((ulong)&local_300,cVar27);
        uVar35 = 0xf;
        if (local_3e0 != &local_3d0) {
          uVar35 = local_3d0;
        }
        if (uVar35 < (ulong)(local_2f8 + local_3d8)) {
          uVar35 = 0xf;
          if (local_300 != &local_2f0) {
            uVar35 = local_2f0;
          }
          if (uVar35 < (ulong)(local_2f8 + local_3d8)) goto LAB_00247eaf;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_3e0);
        }
        else {
LAB_00247eaf:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_300);
        }
        local_4a0 = &local_490;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_490 = *puVar31;
          lStack_488 = puVar11[3];
        }
        else {
          local_490 = *puVar31;
          local_4a0 = (ulong *)*puVar11;
        }
        local_498 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)puVar31 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        local_450 = &local_440;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_440 = *puVar31;
          lStack_438 = puVar11[3];
        }
        else {
          local_440 = *puVar31;
          local_450 = (ulong *)*puVar11;
        }
        local_448 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_100 = &local_f0;
        std::__cxx11::string::_M_construct((ulong)&local_100,cVar27 + '\x03');
        uVar35 = 0xf;
        if (local_450 != &local_440) {
          uVar35 = local_440;
        }
        if (uVar35 < (ulong)(local_f8 + local_448)) {
          uVar35 = 0xf;
          if (local_100 != &local_f0) {
            uVar35 = local_f0;
          }
          if (uVar35 < (ulong)(local_f8 + local_448)) goto LAB_00248016;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_450);
        }
        else {
LAB_00248016:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_100);
        }
        local_480 = &local_470;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_470 = *plVar10;
          lStack_468 = puVar11[3];
        }
        else {
          local_470 = *plVar10;
          local_480 = (long *)*puVar11;
        }
        local_478 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar19;
          __str_1._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_1._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_1,(ulong)this->viewName[sVar18]._M_dataplus._M_p
                                    );
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar19;
          __str_14._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_14._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_598;
        puVar31 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar31) {
          local_598._M_allocated_capacity = *puVar31;
          local_598._8_8_ = puVar11[3];
        }
        else {
          local_598._M_allocated_capacity = *puVar31;
          off = (size_t)*puVar11;
        }
        local_5a0 = puVar11[1];
        *puVar11 = puVar31;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)this->viewName[sVar18]._M_dataplus._M_p);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2.field_2._8_8_ = plVar10[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar19;
          __str_2._M_dataplus._M_p = (pointer)*plVar10;
        }
        __str_2._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar10[3];
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_608._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_608,(ulong)closeLoopString._M_dataplus._M_p);
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString.field_2._8_8_ = plVar10[3];
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar19;
          loopString._M_dataplus._M_p = (pointer)*plVar10;
        }
        loopString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar19 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar19) {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString.field_2._8_8_ = plVar10[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar19;
          productString._M_dataplus._M_p = (pointer)*plVar10;
        }
        productString._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_598) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_428 != &local_418) {
          operator_delete(local_428);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8);
        }
        puVar31 = local_120;
        if (local_120 != &local_110) {
LAB_002486a0:
          operator_delete(puVar31);
        }
      }
      sVar18 = outViewID;
      if (multifaq::cppgen::COMPRESS_AGGREGATES == '\x01') {
        productString._M_dataplus._M_p = (pointer)0x0;
        loopString._M_dataplus._M_p = (pointer)0x0;
        __str_2._M_dataplus._M_p = (pointer)0x0;
        pvVar6 = (this->aggregateComputation).
                 super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_458 = outViewID;
        mapAggregateToIndexes
                  (this,(AggregateIndexes *)&productString,
                   pvVar6[outViewID].
                   super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                   super__Vector_impl_data._M_start,&outViewID,&maxDepth);
        off = 0;
        lVar23 = *(long *)&pvVar6[sVar18].
                           super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                           _M_impl.super__Vector_impl_data;
        if (1 < (ulong)(((long)*(pointer *)
                                ((long)&pvVar6[sVar18].
                                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar23 >> 3) *
                       0x193d4bb7e327a977)) {
          uVar35 = 1;
          lVar36 = 0x238;
          do {
            loopString.field_2._M_allocated_capacity = 0;
            loopString.field_2._8_8_ = 0;
            loopString._M_dataplus._M_p = (pointer)0x0;
            loopString._M_string_length = 0;
            mapAggregateToIndexes
                      (this,(AggregateIndexes *)&loopString,(AggregateTuple *)(lVar23 + lVar36),
                       &outViewID,&maxDepth);
            bVar8 = AggregateIndexes::isIncrement
                              ((AggregateIndexes *)&loopString,(AggregateIndexes *)&productString,
                               &off,(bitset<7UL> *)&__str_2);
            if (bVar8) {
              off = off + 1;
            }
            else {
              outputFinalRegTupleString_abi_cxx11_
                        (&local_608,this,(AggregateIndexes *)&productString,off,
                         (bitset<7UL> *)&__str_2,(size_t)local_430);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_608._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p);
              }
              psVar29 = &loopString;
              psVar32 = &productString;
              for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
                (psVar32->_M_dataplus)._M_p = (psVar29->_M_dataplus)._M_p;
                psVar29 = (string *)((long)psVar29 + (ulong)bVar37 * -0x10 + 8);
                psVar32 = (string *)((long)psVar32 + (ulong)bVar37 * -0x10 + 8);
              }
              off = 0;
              __str_2._M_dataplus._M_p = (pointer)0x0;
            }
            uVar35 = uVar35 + 1;
            pvVar6 = (this->aggregateComputation).
                     super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar23 = *(long *)&pvVar6[sVar18].
                               super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                               _M_impl.super__Vector_impl_data;
            lVar36 = lVar36 + 0x238;
          } while (uVar35 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar6[sVar18].
                                                                                                        
                                                  super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar23 >>
                                    3) * 0x193d4bb7e327a977));
        }
        outputFinalRegTupleString_abi_cxx11_
                  (&local_608,this,(AggregateIndexes *)&productString,off,(bitset<7UL> *)&__str_2,
                   (size_t)local_430);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_608._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p);
        }
      }
      else {
        pvVar6 = (this->aggregateComputation).
                 super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_458 = outViewID;
        pAVar22 = pvVar6[outViewID].
                  super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_430 = *(pointer *)
                     ((long)&pvVar6[outViewID].
                             super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                             _M_impl.super__Vector_impl_data + 8);
        if (pAVar22 != local_430) {
          do {
            __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
            std::__cxx11::string::_M_construct((ulong)&__str_14,cVar27);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
            off = (size_t)&local_598;
            puVar31 = puVar11 + 2;
            if ((ulong *)*puVar11 == puVar31) {
              local_598._M_allocated_capacity = *puVar31;
              local_598._8_8_ = puVar11[3];
            }
            else {
              local_598._M_allocated_capacity = *puVar31;
              off = (size_t)*puVar11;
            }
            local_5a0 = puVar11[1];
            *puVar11 = puVar31;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&off,
                                         (ulong)this->viewName[local_458]._M_dataplus._M_p);
            __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
            psVar19 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar19) {
              __str_2.field_2._M_allocated_capacity = *psVar19;
              __str_2.field_2._8_8_ = plVar10[3];
            }
            else {
              __str_2.field_2._M_allocated_capacity = *psVar19;
              __str_2._M_dataplus._M_p = (pointer)*plVar10;
            }
            __str_2._M_string_length = plVar10[1];
            *plVar10 = (long)psVar19;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
            local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
            psVar19 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar19) {
              local_608.field_2._M_allocated_capacity = *psVar19;
              local_608.field_2._8_8_ = plVar10[3];
            }
            else {
              local_608.field_2._M_allocated_capacity = *psVar19;
              local_608._M_dataplus._M_p = (pointer)*plVar10;
            }
            __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
            local_608._M_string_length = plVar10[1];
            *plVar10 = (long)psVar19;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            uVar35 = pAVar22->aggID;
            cVar28 = '\x01';
            if (9 < uVar35) {
              uVar25 = uVar35;
              cVar26 = '\x04';
              do {
                cVar28 = cVar26;
                if (uVar25 < 100) {
                  cVar28 = cVar28 + -2;
                  goto LAB_00248aa1;
                }
                if (uVar25 < 1000) {
                  cVar28 = cVar28 + -1;
                  goto LAB_00248aa1;
                }
                if (uVar25 < 10000) goto LAB_00248aa1;
                bVar8 = 99999 < uVar25;
                uVar25 = uVar25 / 10000;
                cVar26 = cVar28 + '\x04';
              } while (bVar8);
              cVar28 = cVar28 + '\x01';
            }
LAB_00248aa1:
            std::__cxx11::string::_M_construct((ulong)&__str_1,cVar28);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar35);
            uVar30 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
              uVar30 = local_608.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 < __str_1._M_string_length + local_608._M_string_length) {
              uVar30 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                uVar30 = __str_1.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar30 < __str_1._M_string_length + local_608._M_string_length)
              goto LAB_00248b2e;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&__str_1,0,(char *)0x0,(ulong)local_608._M_dataplus._M_p);
            }
            else {
LAB_00248b2e:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_608,(ulong)__str_1._M_dataplus._M_p);
            }
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
            psVar19 = puVar11 + 2;
            if ((size_type *)*puVar11 == psVar19) {
              loopString.field_2._M_allocated_capacity = *psVar19;
              loopString.field_2._8_8_ = puVar11[3];
            }
            else {
              loopString.field_2._M_allocated_capacity = *psVar19;
              loopString._M_dataplus._M_p = (pointer)*puVar11;
            }
            loopString._M_string_length = puVar11[1];
            *puVar11 = psVar19;
            puVar11[1] = 0;
            *(char *)psVar19 = '\0';
            plVar10 = (long *)std::__cxx11::string::append((char *)&loopString);
            productString._M_dataplus._M_p = (pointer)&productString.field_2;
            psVar19 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar19) {
              productString.field_2._M_allocated_capacity = *psVar19;
              productString.field_2._8_8_ = plVar10[3];
            }
            else {
              productString.field_2._M_allocated_capacity = *psVar19;
              productString._M_dataplus._M_p = (pointer)*plVar10;
            }
            productString._M_string_length = plVar10[1];
            *plVar10 = (long)psVar19;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)productString._M_dataplus._M_p != &productString.field_2) {
              operator_delete(productString._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopString._M_dataplus._M_p != &loopString.field_2) {
              operator_delete(loopString._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
              operator_delete(__str_1._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
              operator_delete(local_608._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)off != &local_598) {
              operator_delete((void *)off);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
              operator_delete(__str_14._M_dataplus._M_p);
            }
            productString._M_dataplus._M_p = (pointer)&productString.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&productString);
            sVar18 = maxDepth;
            uVar35 = (pAVar22->local).first;
            if (uVar35 < maxDepth) {
              lVar23 = *(long *)&(this->productToVariableRegister).
                                 super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar35].
                                 super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar36 = (pAVar22->local).second * 0x100;
              uVar35 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar35].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                           *(long *)(lVar23 + 0xe8 + lVar36) * 0x18) +
                                 *(long *)(lVar23 + 0xf0 + lVar36) * 8);
              cVar28 = '\x01';
              if (9 < uVar35) {
                uVar25 = uVar35;
                cVar26 = '\x04';
                do {
                  cVar28 = cVar26;
                  if (uVar25 < 100) {
                    cVar28 = cVar28 + -2;
                    goto LAB_00248d91;
                  }
                  if (uVar25 < 1000) {
                    cVar28 = cVar28 + -1;
                    goto LAB_00248d91;
                  }
                  if (uVar25 < 10000) goto LAB_00248d91;
                  bVar8 = 99999 < uVar25;
                  uVar25 = uVar25 / 10000;
                  cVar26 = cVar28 + '\x04';
                } while (bVar8);
                cVar28 = cVar28 + '\x01';
              }
LAB_00248d91:
              loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
              std::__cxx11::string::_M_construct((ulong)&loopString,cVar28);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (loopString._M_dataplus._M_p,(uint)loopString._M_string_length,uVar35);
              std::operator+(&__str_2,"aggregateRegister[",&loopString);
              plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
              psVar19 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar19) {
                local_608.field_2._M_allocated_capacity = *psVar19;
                local_608.field_2._8_8_ = plVar10[3];
              }
              else {
                local_608.field_2._M_allocated_capacity = *psVar19;
                local_608._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_608._M_string_length = plVar10[1];
              *plVar10 = (long)psVar19;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)&productString,(ulong)local_608._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)loopString._M_dataplus._M_p != &loopString.field_2) {
                operator_delete(loopString._M_dataplus._M_p);
              }
            }
            uVar35 = (pAVar22->post).first;
            if (uVar35 < sVar18) {
              uVar35 = *(ulong *)(*(long *)&(this->postRemapping).
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar35].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data +
                                 (pAVar22->post).second * 8);
              cVar28 = '\x01';
              if (9 < uVar35) {
                uVar25 = uVar35;
                cVar26 = '\x04';
                do {
                  cVar28 = cVar26;
                  if (uVar25 < 100) {
                    cVar28 = cVar28 + -2;
                    goto LAB_00248f0d;
                  }
                  if (uVar25 < 1000) {
                    cVar28 = cVar28 + -1;
                    goto LAB_00248f0d;
                  }
                  if (uVar25 < 10000) goto LAB_00248f0d;
                  bVar8 = 99999 < uVar25;
                  uVar25 = uVar25 / 10000;
                  cVar26 = cVar28 + '\x04';
                } while (bVar8);
                cVar28 = cVar28 + '\x01';
              }
LAB_00248f0d:
              loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
              std::__cxx11::string::_M_construct((ulong)&loopString,cVar28);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (loopString._M_dataplus._M_p,(uint)loopString._M_string_length,uVar35);
              std::operator+(&__str_2,"postRegister[",&loopString);
              plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
              psVar19 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar19) {
                local_608.field_2._M_allocated_capacity = *psVar19;
                local_608.field_2._8_8_ = plVar10[3];
              }
              else {
                local_608.field_2._M_allocated_capacity = *psVar19;
                local_608._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_608._M_string_length = plVar10[1];
              *plVar10 = (long)psVar19;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)&productString,(ulong)local_608._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)loopString._M_dataplus._M_p != &loopString.field_2) {
                operator_delete(loopString._M_dataplus._M_p);
              }
            }
            if (pAVar22->hasDependentComputation == true) {
              uVar35 = *(ulong *)(*(long *)&(this->depAggregateRemapping).
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [(pAVar22->dependentProdAgg).correspondingLoopAgg.first]
                                            .
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data +
                                 (pAVar22->dependentProdAgg).correspondingLoopAgg.second * 8);
              cVar28 = '\x01';
              if (9 < uVar35) {
                uVar25 = uVar35;
                cVar26 = '\x04';
                do {
                  cVar28 = cVar26;
                  if (uVar25 < 100) {
                    cVar28 = cVar28 + -2;
                    goto LAB_00249094;
                  }
                  if (uVar25 < 1000) {
                    cVar28 = cVar28 + -1;
                    goto LAB_00249094;
                  }
                  if (uVar25 < 10000) goto LAB_00249094;
                  bVar8 = 99999 < uVar25;
                  uVar25 = uVar25 / 10000;
                  cVar26 = cVar28 + '\x04';
                } while (bVar8);
                cVar28 = cVar28 + '\x01';
              }
LAB_00249094:
              loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
              std::__cxx11::string::_M_construct((ulong)&loopString,cVar28);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (loopString._M_dataplus._M_p,(uint)loopString._M_string_length,uVar35);
              std::operator+(&__str_2,"aggregateRegister[",&loopString);
              plVar10 = (long *)std::__cxx11::string::append((char *)&__str_2);
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
              psVar19 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar19) {
                local_608.field_2._M_allocated_capacity = *psVar19;
                local_608.field_2._8_8_ = plVar10[3];
              }
              else {
                local_608.field_2._M_allocated_capacity = *psVar19;
                local_608._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_608._M_string_length = plVar10[1];
              *plVar10 = (long)psVar19;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)&productString,(ulong)local_608._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)loopString._M_dataplus._M_p != &loopString.field_2) {
                operator_delete(loopString._M_dataplus._M_p);
              }
            }
            if (productString._M_string_length == 0) {
              std::__cxx11::string::_M_replace((ulong)&productString,0,(char *)0x0,0x2b0db7);
            }
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
            std::__cxx11::string::pop_back();
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)productString._M_dataplus._M_p != &productString.field_2) {
              operator_delete(productString._M_dataplus._M_p);
            }
            pAVar22 = pAVar22 + 1;
          } while (pAVar22 != local_430);
        }
      }
      v_id = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_138,
                        local_458);
      outViewID = v_id;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
    } while (v_id != 0xffffffffffffffff);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depthString._M_dataplus._M_p != &depthString.field_2) {
    operator_delete(depthString._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genDependentAggLoopString(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews, const size_t maxDepth,std::string& resetString)
{
    const size_t thisLoopID = currentLoop;

    const DependentLoop& depLoop = depListOfLoops[thisLoopID];
    const dyn_bitset& thisLoop = depLoop.loopFactors;

    size_t numOfLoops = thisLoop.count();

    std::string returnString = "";

    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];

        // We turn the product into a string 
        std::string productString = genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString+";\n";
        
        // increment the counter and update the remapping array
        depLocalProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    // for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size();
    // ++viewProd)
    // {
    //     std::string viewProduct = "";
    //     for (const std::pair<size_t, size_t>& viewAgg :
    //              viewProductList[thisLoopID][viewProd])
    //     {
    //         viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
    //             std::to_string(viewAgg.second)+"]*";
    //     }   
    //     viewProduct.pop_back();
    //     returnString += offset(3+depth+numOfLoops)+
    //         "viewRegister["+std::to_string(viewCounter)+"] = "+
    //         viewProduct +";\n";
    //     // Increment the counter and update the remapping array
    //     viewProductRemapping[thisLoopID][viewProd] = viewCounter;
    //     ++viewCounter;
    // }    
    
    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {        
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }

            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
            
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";

            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;

        }
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < depLoop.next.size(); ++next)
    {
        size_t nextLoop = depLoop.next[next];
        DependentLoop& nextDepLoop = depListOfLoops[nextLoop];
        
        if (((nextDepLoop.loopFactors & thisLoop) == thisLoop))
        {
            size_t viewID = nextDepLoop.loopVariable;

            std::string resetAggregates = "";
            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            // std::cout<< "Call genDependentAggLoopString from 1 \n";
            loopString += genDependentAggLoopString(
                node, nextLoop, depth, contributingViews, maxDepth, resetAggregates);
            
            returnString += resetAggregates+loopString+closeLoopString;

            // After recurse, add the aggregates that have been added with post FLAG
            for (size_t aggID = 0; aggID <
                     newAggregateRegister[nextLoop].size(); ++aggID)
            {
                const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                if (regTuple.postLoopAgg)
                {

                    // TODO: TODO:  Make sure this is correct -- Can we use
                    // equality here?

                    // We use a mapping to the correct index
                    returnString += offset(3+depth+numOfLoops)+
                        "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";
                    
                    if (regTuple.previous.first < depListOfLoops.size())
                    {
                        std::string local = std::to_string(
                            newAggregateRemapping[depth]
                            [regTuple.previous.first]
                            [regTuple.previous.second]);
                        returnString += "aggregateRegister["+local+"]*";
                    }

                    if (regTuple.postLoop.first < depListOfLoops.size())
                    {
                        std::string post = std::to_string(
                            newAggregateRemapping[depth][regTuple.postLoop.first]
                            [regTuple.postLoop.second]); 
                        returnString += "aggregateRegister["+post+"]*";
                    }
                    
                    returnString.pop_back();
                    returnString += ";\n";
            
                    // Increment the counter and update the remapping array
                    depAggregateRemapping[nextLoop][aggID] = aggregateCounter;
                    ++aggregateCounter;
                }
            }
        }
        else break;
    }


    size_t startingOffset = aggregateCounter;

    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (!regTuple.postLoopAgg && !regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }
            
            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
        
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            if (regTuple.postLoop.first < depListOfLoops.size())
            {
                std::string postLoop = std::to_string(
                    newAggregateRemapping[depth][regTuple.postLoop.first]
                    [regTuple.postLoop.second]);
                returnString += "aggregateRegister["+postLoop+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";
            
            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;
        }
    }

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    size_t outViewID = depLoop.outView.find_first();
    while (outViewID != boost::dynamic_bitset<>::npos)
    {
        View* view = _qc->getView(outViewID);
        
        // Add the code that outputs tuples for the views           
        std::string viewVars = "";            
        for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
        {
            if (view->_fVars[v])
            {
                if (node._bag[v])
                {
                    viewVars += node._name+"Tuple."+
                        _td->getAttribute(v)->_name+",";
                }
                else
                {
                    for (const size_t& incViewID : incomingViews[outViewID])
                    {
                        View* view = _qc->getView(incViewID);
                        if (view->_fVars[v])
                        {
                            viewVars += viewName[incViewID]+"Tuple."+
                                _td->getAttribute(v)->_name+",";
                            break;
                        }
                    }
                }
            }
        }
        viewVars.pop_back();

        // size_t offDepth = numOfLoops+depth+3;
        size_t offDepth = (depth + 1 < maxDepth ?
                           4+depth+numOfLoops : 3+depth+numOfLoops);
        
        if (_requireHashing[outViewID])
        {

            returnString +=
                offset(offDepth)+viewName[outViewID]+"_iterator = "+
                viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                offset(offDepth)+"if ("+viewName[outViewID]+"_iterator != "+
                viewName[outViewID]+"_map.end())\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_iterator->second.aggregates[0];\n"+
                offset(offDepth)+"else\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_map.insert({{"+viewVars+
                "},{}}).first->second.aggregates[0];\n";

            // This code is an alternative way to update the views that require hashing
            // returnString +=
            //     offset(offDepth)+viewName[outViewID]+"_pair = "+
            //     viewName[outViewID]+"_map.insert({{"+viewVars+"},"+
            //     viewName[outViewID]+".size()});\n"+
            //     offset(offDepth)+"if ("+viewName[outViewID]+"_pair.second)\n"+
            //     offset(offDepth)+"{\n"+
            //     offset(offDepth+1)+viewName[outViewID]+
            //     ".emplace_back("+viewVars+");\n"+
            //     offset(offDepth)+"}\n"+
            //     offset(offDepth)+"aggregates_"+viewName[outViewID]+
            //     " = "+viewName[outViewID]+"["+viewName[outViewID]+
            //     "_pair.first->second].aggregates;\n";

                // "//-----------------------------\n"+
                // offset(offDepth)+viewName[outViewID]+"_iterator"+
                // " = "+viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                // offset(offDepth)+"if ("+viewName[outViewID]+"_iterator"
                // " != "+viewName[outViewID]+"_map.end())\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"["+viewName[outViewID]+
                // "_iterator->second].aggregates;\n"+
                // offset(offDepth)+"}\n"+
                // offset(offDepth)+"else\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"size_t idx_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+".size();\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // // "_map.emplace("+viewVars+",idx_"+viewName[outViewID]+");\n"+
                // "_map[{"+viewVars+"}] = idx_"+viewName[outViewID]+";\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // ".emplace_back("+viewVars+");\n"+
                // // ".push_back({"+viewVars+"});\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"[idx_"+viewName[outViewID]+
                // "].aggregates;\n"+
                // offset(offDepth)+"}\n";
        }
        else
        {
            // just add string to push to view
            returnString += offset(offDepth)+viewName[outViewID]+
                ".emplace_back("+viewVars+");\n"+offset(offDepth)+
                // ".push_back({"+viewVars+"});\n"+offset(offDepth)+
                "aggregates_"+viewName[outViewID]+" = "+viewName[outViewID]+
                ".back().aggregates;\n";
        }

        if (COMPRESS_AGGREGATES)
        {
            AggregateIndexes bench, aggIdx;
            std::bitset<7> increasingIndexes;
        
            mapAggregateToIndexes(bench,aggregateComputation[outViewID][0],
                                  outViewID,maxDepth);
        
            size_t off = 0;
            for (size_t aggID = 1; aggID <
                     aggregateComputation[outViewID].size(); ++aggID)
            {
                const AggregateTuple& tuple = aggregateComputation[outViewID][aggID];

                aggIdx.reset();
                mapAggregateToIndexes(aggIdx,tuple,outViewID,maxDepth);

                // if (outViewID == 0)
                //     std::cout << aggID << " : " << increasingIndexes << std::endl;

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputFinalRegTupleString(
                        bench,off,increasingIndexes,offDepth);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                    increasingIndexes.reset();
                }
            }

            // If not, output bench and all offset
            // aggregateString
            returnString += outputFinalRegTupleString(
                bench,off,increasingIndexes,offDepth);
        }
        else 
        {
            for(const AggregateTuple& aggTuple : aggregateComputation[outViewID])
            {
                returnString += offset(offDepth)+"aggregates_"+
                    viewName[outViewID]+"["+std::to_string(aggTuple.aggID)+
                    "] += ";

                std::string aggBody = "";
                if (aggTuple.local.first < maxDepth)
                {
                    const ProductAggregate& prodAgg =
                        productToVariableRegister[aggTuple.local.first]
                        [aggTuple.local.second];
        
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        prodAgg.correspondingLoopAgg;
                    
                    std::string prev = std::to_string(
                        newAggregateRemapping[aggTuple.local.first]
                        [correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);
                
                    aggBody += "aggregateRegister["+prev+"]*";
                }
                if (aggTuple.post.first < maxDepth)
                {
                    std::string post = std::to_string(
                        postRemapping[aggTuple.post.first]
                        [aggTuple.post.second]);
                    aggBody += "postRegister["+post+"]*";
                }

                if (aggTuple.hasDependentComputation)
                {
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        aggTuple.dependentProdAgg.correspondingLoopAgg;
                
                    std::string prev = std::to_string(
                        depAggregateRemapping[correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);

                    aggBody += "aggregateRegister["+prev+"]*";
                }
                // TODO:TODO:TODO: ---> make sure this is correct
                if (aggBody.empty())
                    aggBody = "1*";
                returnString += aggBody;
                returnString.pop_back();
                returnString += ";\n";            
            }
        }

        outViewID = depLoop.outView.find_next(outViewID);
    }

    return returnString;
}